

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetClearSparseImage(IceTSparseImage image)

{
  IceTBoolean IVar1;
  IceTSizeType IVar2;
  IceTByte *data;
  IceTSparseImage image_local;
  
  IVar1 = icetSparseImageIsNull(image);
  if (IVar1 == '\0') {
    IVar2 = icetSparseImageGetNumPixels(image);
    *(IceTSizeType *)((long)image.opaque_internals + 0x1c) = IVar2;
    *(undefined4 *)((long)image.opaque_internals + 0x20) = 0;
    icetSparseImageSetActualSize(image,image.opaque_internals + 0x24);
  }
  return;
}

Assistant:

void icetClearSparseImage(IceTSparseImage image)
{
    IceTByte *data;

    ICET_TEST_SPARSE_IMAGE_HEADER(image);

    if (icetSparseImageIsNull(image)) { return; }

    /* Use IceTByte for byte-based pointer arithmetic. */
    data = ICET_IMAGE_DATA(image);
    INACTIVE_RUN_LENGTH(data) = icetSparseImageGetNumPixels(image);
    ACTIVE_RUN_LENGTH(data) = 0;

    icetSparseImageSetActualSize(image, data+RUN_LENGTH_SIZE);
}